

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::RemoveAt(SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
           *this,int i,int last,uint targetBucket)

{
  RecyclerWeakReferenceRegionItem<Js::PropertyString_*> *pRVar1;
  ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> *pVVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  int iVar6;
  int *piVar7;
  uint uVar8;
  
  pVVar2 = (this->entries).ptr;
  piVar7 = &pVVar2[(uint)last].super_ValueEntryData<int>.next;
  if (last < 0) {
    piVar7 = (this->buckets).ptr + targetBucket;
  }
  *piVar7 = pVVar2[i].super_ValueEntryData<int>.next;
  (this->entries).ptr[i].super_ValueEntryData<int>.value = 0;
  pRVar1 = (this->weakRefs).ptr + i;
  pRVar1->ptr = (Type)0x0;
  pRVar1->heapBlock = (Type)0x0;
  pVVar2 = (this->entries).ptr;
  uVar8 = -(uint)(this->freeCount == 0) | this->freeList;
  if (pVVar2[i].super_ValueEntryData<int>.next < -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                       ,0x19e,"(!IsFreeEntry(freeEntry))","!IsFreeEntry(freeEntry)");
    if (!bVar4) goto LAB_00ce1933;
    *puVar5 = 0;
  }
  if ((int)uVar8 < -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                       ,0x19f,"(nextFreeEntryIndex >= -1)","nextFreeEntryIndex >= -1");
    if (!bVar4) goto LAB_00ce1933;
    *puVar5 = 0;
  }
  if (this->count <= (int)uVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                       ,0x1a0,"(nextFreeEntryIndex < count)","nextFreeEntryIndex < count");
    if (!bVar4) {
LAB_00ce1933:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  iVar6 = -2 - uVar8;
  if ((int)uVar8 < 0) {
    iVar6 = -2;
  }
  pVVar2[i].super_ValueEntryData<int>.next = iVar6;
  this->freeList = i;
  this->freeCount = this->freeCount + 1;
  return;
}

Assistant:

inline void RemoveAt(const int i, const int last, const uint targetBucket)
        {
            if (last < 0)
            {
                buckets[targetBucket] = entries[i].next;
            }
            else
            {
                entries[last].next = entries[i].next;
            }
            entries[i].Clear();
            weakRefs[i].Clear();
            SetNextFreeEntryIndex(entries[i], freeCount == 0 ? -1 : freeList);
            freeList = i;
            freeCount++;
        }